

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mesh.cpp
# Opt level: O1

void __thiscall Mesh::_drawList(Mesh *this)

{
  (*glad_glEnable)(0xde1);
  (*glad_glTexEnvf)(0x2300,0x2200,8448.0);
  (*glad_glBindTexture)(0xde1,this->_texture->id);
  (*glad_glEnableClientState)(0x8074);
  (*glad_glEnableClientState)(0x8075);
  (*glad_glEnableClientState)(0x8078);
  (*glad_glVertexPointer)
            (3,0x1406,0,
             (this->_meshData->vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start);
  (*glad_glTexCoordPointer)
            (2,0x1406,0,
             (this->_meshData->textureCoordinates).super__Vector_base<float,_std::allocator<float>_>
             ._M_impl.super__Vector_impl_data._M_start);
  (*glad_glNormalPointer)
            (0x1406,0,(this->_meshData->normals).super__Vector_base<float,_std::allocator<float>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  (*glad_glDrawArrays)(4,0,(GLsizei)this->_meshData->numVertices);
  (*glad_glDisableClientState)(0x8074);
  (*glad_glDisableClientState)(0x8075);
  (*glad_glDisableClientState)(0x8078);
  (*glad_glDisable)(0xde1);
  return;
}

Assistant:

void Mesh::_drawList() {
    // Enable texture
    glEnable(GL_TEXTURE_2D);
    glTexEnvf(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, GL_MODULATE);
    glBindTexture(GL_TEXTURE_2D, _texture->id);

    // Draw the mesh
    glEnableClientState(GL_VERTEX_ARRAY); //enable vertex array
    glEnableClientState(GL_NORMAL_ARRAY); //enable normal array
    glEnableClientState(GL_TEXTURE_COORD_ARRAY); //enable texcoord array

    glVertexPointer(3, GL_FLOAT, 0, &_meshData->vertices[0]); //give vertex array to OGL
    glTexCoordPointer(2, GL_FLOAT, 0, &_meshData->textureCoordinates[0]); //same with texcoord array
    glNormalPointer(GL_FLOAT, 0, &_meshData->normals[0]); //and normal array

    glDrawArrays(GL_TRIANGLES, 0, (GLsizei)_meshData->numVertices);

    glDisableClientState(GL_VERTEX_ARRAY); //disable the client states again
    glDisableClientState(GL_NORMAL_ARRAY);
    glDisableClientState(GL_TEXTURE_COORD_ARRAY);

    glDisable(GL_TEXTURE_2D);
}